

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGradientDescent.hpp
# Opt level: O0

void __thiscall
TasOptimization::GradientDescentState::setX
          (GradientDescentState *this,vector<double,_std::allocator<double>_> *x_new)

{
  size_type sVar1;
  size_type sVar2;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  vector<double,_std::allocator<double>_> *local_18;
  vector<double,_std::allocator<double>_> *x_new_local;
  GradientDescentState *this_local;
  
  local_18 = x_new;
  x_new_local = (vector<double,_std::allocator<double>_> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"GradientDescentState::setCandidate",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"candidate point",&local_71);
  sVar1 = std::vector<double,_std::allocator<double>_>::size(local_18);
  sVar2 = std::vector<double,_std::allocator<double>_>::size(&this->x);
  checkVarSize(&local_38,&local_70,(int)sVar1,(int)sVar2);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  std::vector<double,_std::allocator<double>_>::operator=(&this->x,local_18);
  return;
}

Assistant:

inline void setX(const std::vector<double> &x_new) {
        checkVarSize("GradientDescentState::setCandidate", "candidate point", x_new.size(), x.size());
        x = x_new;
    }